

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

void emitASMArray(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name,
                 ostream *os)

{
  ostream *poVar1;
  long lVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  if ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    puVar5 = (pointer)0x0;
    do {
      if (((ulong)puVar5 & 0xf) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n\tDB ",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"$",1);
      lVar2 = *(long *)os;
      poVar1 = os + *(long *)(lVar2 + -0x18);
      if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar1);
        poVar1[0xe1] = (ostream)0x1;
        lVar2 = *(long *)os;
      }
      poVar1[0xe0] = (ostream)0x30;
      *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 2;
      *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<
                ((ostream *)os,
                 (uint)puVar5[(long)(data->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start]);
      puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar5 != puVar3 + ~(ulong)puVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        puVar4 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 < puVar3 + -(long)puVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void emitASMArray(
	const std::vector<unsigned char> &data,
	const std::string &name,
	std::ostream &os
) {
	os << name << ":";
	for(size_t i = 0; i < data.size(); ++i) {
		if(i % 16 == 0) os << "\n\tDB ";
		os << "$" << std::setfill('0') << std::setw(2) << std::hex << std::uppercase << (int)data[i];
		if(i != data.size()-1) os << ", ";
	}
	os << std::endl;
}